

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlBufGetNodeContent(xmlBufPtr buf,xmlNode *cur)

{
  _xmlNode *p_Var1;
  xmlNode *pxVar2;
  xmlEntityPtr pxVar3;
  _xmlNode *cur_00;
  _xmlNode **pp_Var4;
  long lStack_30;
  
  if (buf == (xmlBufPtr)0x0 || cur == (xmlNode *)0x0) {
    return -1;
  }
  switch(cur->type) {
  case XML_ELEMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
    p_Var1 = cur;
    do {
      do {
        cur_00 = p_Var1;
        if (cur_00 == (xmlNode *)0x0) {
          return 0;
        }
        if (cur_00->type - XML_TEXT_NODE < 2) {
          if (cur_00->content != (xmlChar *)0x0) {
            xmlBufCat(buf,cur_00->content);
          }
        }
        else if (cur_00->type == XML_ENTITY_REF_NODE) {
          xmlBufGetNodeContent(buf,cur_00);
        }
        p_Var1 = cur_00->children;
      } while ((p_Var1 != (_xmlNode *)0x0) && (p_Var1->type != XML_ENTITY_DECL));
      if (cur_00 == cur) {
        return 0;
      }
      do {
        p_Var1 = cur_00->next;
        if (cur_00->next != (_xmlNode *)0x0) break;
        cur_00 = cur_00->parent;
        if (cur_00 == (_xmlNode *)0x0) {
          p_Var1 = (xmlNode *)0x0;
          break;
        }
        p_Var1 = (xmlNode *)0x0;
      } while (cur_00 != cur);
    } while( true );
  case XML_ATTRIBUTE_NODE:
    pp_Var4 = &cur->children;
    while (pxVar2 = *pp_Var4, pxVar2 != (xmlNode *)0x0) {
      if (pxVar2->type == XML_TEXT_NODE) {
        xmlBufCat(buf,pxVar2->content);
      }
      else {
        xmlBufGetNodeContent(buf,pxVar2);
      }
      pp_Var4 = &pxVar2->next;
    }
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    lStack_30 = 0x50;
    goto LAB_0018222e;
  case XML_ENTITY_REF_NODE:
    pxVar3 = xmlGetDocEntity(cur->doc,cur->name);
    if (pxVar3 == (xmlEntityPtr)0x0) {
      return -1;
    }
    pp_Var4 = &pxVar3->children;
    while (pxVar2 = *pp_Var4, pxVar2 != (xmlNode *)0x0) {
      xmlBufGetNodeContent(buf,pxVar2);
      pp_Var4 = &pxVar2->next;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pp_Var4 = &cur->children;
    while (pxVar2 = *pp_Var4, pxVar2 != (xmlNode *)0x0) {
      if ((pxVar2->type < XML_ENTITY_REF_NODE) &&
         ((0x1aU >> (pxVar2->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
        xmlBufGetNodeContent(buf,pxVar2);
      }
      pp_Var4 = &pxVar2->next;
    }
    break;
  case XML_NAMESPACE_DECL:
    lStack_30 = 0x10;
LAB_0018222e:
    xmlBufCat(buf,*(xmlChar **)((long)&cur->_private + lStack_30));
  }
  return 0;
}

Assistant:

int
xmlBufGetNodeContent(xmlBufPtr buf, const xmlNode *cur)
{
    if ((cur == NULL) || (buf == NULL)) return(-1);
    switch (cur->type) {
        case XML_CDATA_SECTION_NODE:
        case XML_TEXT_NODE:
	    xmlBufCat(buf, cur->content);
            break;
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:{
                const xmlNode *tmp = cur;

                while (tmp != NULL) {
                    switch (tmp->type) {
                        case XML_CDATA_SECTION_NODE:
                        case XML_TEXT_NODE:
                            if (tmp->content != NULL)
                                xmlBufCat(buf, tmp->content);
                            break;
                        case XML_ENTITY_REF_NODE:
                            xmlBufGetNodeContent(buf, tmp);
                            break;
                        default:
                            break;
                    }
                    /*
                     * Skip to next node
                     */
                    if (tmp->children != NULL) {
                        if (tmp->children->type != XML_ENTITY_DECL) {
                            tmp = tmp->children;
                            continue;
                        }
                    }
                    if (tmp == cur)
                        break;

                    if (tmp->next != NULL) {
                        tmp = tmp->next;
                        continue;
                    }

                    do {
                        tmp = tmp->parent;
                        if (tmp == NULL)
                            break;
                        if (tmp == cur) {
                            tmp = NULL;
                            break;
                        }
                        if (tmp->next != NULL) {
                            tmp = tmp->next;
                            break;
                        }
                    } while (tmp != NULL);
                }
		break;
            }
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;
		xmlNodePtr tmp = attr->children;

		while (tmp != NULL) {
		    if (tmp->type == XML_TEXT_NODE)
		        xmlBufCat(buf, tmp->content);
		    else
		        xmlBufGetNodeContent(buf, tmp);
		    tmp = tmp->next;
		}
                break;
            }
        case XML_COMMENT_NODE:
        case XML_PI_NODE:
	    xmlBufCat(buf, cur->content);
            break;
        case XML_ENTITY_REF_NODE:{
                xmlEntityPtr ent;
                xmlNodePtr tmp;

                /* lookup entity declaration */
                ent = xmlGetDocEntity(cur->doc, cur->name);
                if (ent == NULL)
                    return(-1);

                /* an entity content can be any "well balanced chunk",
                 * i.e. the result of the content [43] production:
                 * http://www.w3.org/TR/REC-xml#NT-content
                 * -> we iterate through child nodes and recursive call
                 * xmlNodeGetContent() which handles all possible node types */
                tmp = ent->children;
                while (tmp) {
		    xmlBufGetNodeContent(buf, tmp);
                    tmp = tmp->next;
                }
		break;
            }
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    cur = cur->children;
	    while (cur!= NULL) {
		if ((cur->type == XML_ELEMENT_NODE) ||
		    (cur->type == XML_TEXT_NODE) ||
		    (cur->type == XML_CDATA_SECTION_NODE)) {
		    xmlBufGetNodeContent(buf, cur);
		}
		cur = cur->next;
	    }
	    break;
        case XML_NAMESPACE_DECL:
	    xmlBufCat(buf, ((xmlNsPtr) cur)->href);
	    break;
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            break;
    }
    return(0);
}